

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
slang::CommandLine::handlePlusArg
          (CommandLine *this,string_view arg,ParseOptions options,bool *hadUnknowns)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  iterator iVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  __s;
  size_type __n;
  ulong __n_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar8;
  ulong uVar9;
  string_view name;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view name_00;
  string_view value;
  format_args args;
  format_args args_00;
  format_args args_01;
  string result;
  string result_1;
  key_type local_a8;
  string local_88;
  CommandLine *local_68;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  Option *local_58;
  string local_50;
  
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)arg._M_str;
  __n_00 = arg._M_len;
  local_68 = this;
  if (__n_00 < 3) {
LAB_001b7014:
    __s.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
    uVar4 = 0;
    uVar9 = __n_00;
  }
  else {
    pvVar2 = memchr(paVar5->_M_local_buf + 2,0x2b,__n_00 - 2);
    uVar9 = (long)pvVar2 - (long)paVar5;
    if (uVar9 == 0xffffffffffffffff || pvVar2 == (void *)0x0) goto LAB_001b7014;
    lVar6 = uVar9 + 1;
    if (__n_00 <= uVar9) {
LAB_001b72f9:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar6,__n_00);
    }
    __s.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)
                  (paVar5->_M_local_buf + lVar6);
    uVar4 = __n_00 - lVar6;
  }
  __n_00 = uVar4;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,paVar5,paVar5->_M_local_buf + uVar9);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
          ::find(&(local_68->optionMap)._M_t,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  if ((_Rb_tree_header *)iVar3._M_node == &(local_68->optionMap)._M_t._M_impl.super__Rb_tree_header)
  {
    *hadUnknowns = true;
    local_a8._M_dataplus._M_p = (local_68->programName)._M_dataplus._M_p;
    local_a8._M_string_length = (local_68->programName)._M_string_length;
    pvVar7 = &local_68->errors;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x26;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_a8;
    local_a8.field_2._M_allocated_capacity = (size_type)paVar5;
    local_a8.field_2._8_8_ = uVar9;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_88,(v9 *)"{}: unknown command line argument \'{}\'",fmt_00,args_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar7,&local_88
              );
  }
  else {
    local_58 = *(Option **)(iVar3._M_node + 2);
    if (__n_00 != 0) {
      local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &local_68->errors;
      do {
        pvVar2 = memchr(__s.values_,0x2b,__n_00);
        uVar4 = (long)pvVar2 - (long)__s;
        if (uVar4 == 0xffffffffffffffff || pvVar2 == (void *)0x0) {
          aVar8.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
          uVar4 = __n_00;
          __n_00 = 0;
        }
        else {
          lVar6 = uVar4 + 1;
          if (__n_00 <= uVar4) goto LAB_001b72f9;
          __n_00 = __n_00 - lVar6;
          aVar8.args_ = lVar6 + __s.args_;
        }
        name._M_str = (char *)paVar5;
        name._M_len = uVar9;
        value._M_str = (char *)__s.values_;
        value._M_len = uVar4;
        Option::set_abi_cxx11_(&local_88,local_58,name,value,(bool)(options.ignoreDuplicates & 1));
        if (local_88._M_string_length != 0) {
          local_a8._M_dataplus._M_p = (local_68->programName)._M_dataplus._M_p;
          local_a8._M_string_length = (local_68->programName)._M_string_length;
          local_a8.field_2._M_allocated_capacity = (size_type)local_88._M_dataplus._M_p;
          local_a8.field_2._8_8_ = local_88._M_string_length;
          fmt.size_ = 0xdd;
          fmt.data_ = (char *)0x6;
          args.field_1.values_ = __s.values_;
          args.desc_ = (unsigned_long_long)&local_a8;
          ::fmt::v9::vformat_abi_cxx11_(&local_50,(v9 *)"{}: {}",fmt,args);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_60,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          (ulong)(local_88.field_2._M_allocated_capacity + 1));
        }
        __s = aVar8;
        if (__n_00 == 0) {
          return;
        }
      } while( true );
    }
    if (*(__index_type *)
         ((long)&(local_58->storage).
                 super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                 .
                 super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
         + 0x20) == '\0') {
      name_00._M_str = (char *)paVar5;
      name_00._M_len = uVar9;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = __s;
      Option::set_abi_cxx11_
                (&local_a8,local_58,name_00,(string_view)(auVar1 << 0x40),
                 (bool)(options.ignoreDuplicates & 1));
      if (local_a8._M_string_length != 0) {
        assert::assertFailed
                  ("result.empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/util/CommandLine.cpp"
                   ,0x240,
                   "void slang::CommandLine::handlePlusArg(string_view, ParseOptions, bool &)");
      }
      local_88.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
      local_88._M_dataplus._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return;
      }
      goto LAB_001b728a;
    }
    local_a8._M_dataplus._M_p = (local_68->programName)._M_dataplus._M_p;
    local_a8._M_string_length = (local_68->programName)._M_string_length;
    pvVar7 = &local_68->errors;
    fmt_01.size_ = 0xdd;
    fmt_01.data_ = (char *)0x27;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_a8;
    local_a8.field_2._M_allocated_capacity = (size_type)paVar5;
    local_a8.field_2._8_8_ = uVar9;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_88,(v9 *)"{}: no value provided for argument \'{}\'",fmt_01,args_01);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar7,&local_88
              );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    return;
  }
LAB_001b728a:
  operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void CommandLine::handlePlusArg(string_view arg, ParseOptions options, bool& hadUnknowns) {
    // Values are plus separated.
    string_view value;
    size_t idx = arg.find_first_of('+', 2);
    if (idx != string_view::npos) {
        value = arg.substr(idx + 1);
        arg = arg.substr(0, idx);
    }

    // TODO: change once we have heterogeneous lookup from C++20
    auto it = optionMap.find(std::string(arg));
    if (it == optionMap.end()) {
        hadUnknowns = true;
        errors.emplace_back(
            fmt::format("{}: unknown command line argument '{}'"sv, programName, arg));
        return;
    }

    auto option = it->second.get();
    if (value.empty()) {
        if (option->expectsValue()) {
            errors.emplace_back(
                fmt::format("{}: no value provided for argument '{}'"sv, programName, arg));
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            ASSERT(result.empty());
        }
        return;
    }

    do {
        string_view curr = value;
        idx = value.find_first_of('+');
        if (idx != string_view::npos) {
            value = value.substr(idx + 1);
            curr = curr.substr(0, idx);
        }
        else {
            value = {};
        }

        std::string result = option->set(arg, curr, options.ignoreDuplicates);
        if (!result.empty())
            errors.emplace_back(fmt::format("{}: {}", programName, result));

    } while (!value.empty());
}